

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int float128_eq_s390x(float128 a,float128 b,float_status *status)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  
  uVar1 = b.high;
  uVar2 = a.high;
  uVar3 = a.low;
  if ((((~uVar2 & 0x7fff000000000000) == 0) &&
      (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
       uVar3 != 0)) ||
     (((~uVar1 & 0x7fff000000000000) == 0 &&
      (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
       b.low != 0)))) {
    status->float_exception_flags = status->float_exception_flags | 1;
    return 0;
  }
  if (uVar3 == b.low) {
    if (uVar2 == uVar1) {
      return 1;
    }
    if (uVar3 == 0) {
      return (int)(((uVar1 | uVar2) & 0x7fffffffffffffff) == 0);
    }
  }
  return 0;
}

Assistant:

int float128_eq(float128 a, float128 b, float_status *status)
{

    if (    (    ( extractFloat128Exp( a ) == 0x7FFF )
              && ( extractFloat128Frac0( a ) | extractFloat128Frac1( a ) ) )
         || (    ( extractFloat128Exp( b ) == 0x7FFF )
              && ( extractFloat128Frac0( b ) | extractFloat128Frac1( b ) ) )
       ) {
        float_raise(float_flag_invalid, status);
        return 0;
    }
    return
           ( a.low == b.low )
        && (    ( a.high == b.high )
             || (    ( a.low == 0 )
                  && ( (uint64_t) ( ( a.high | b.high )<<1 ) == 0 ) )
           );

}